

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

void duckdb_lz4::LZ4_resetStream_fast(LZ4_stream_t *ctx)

{
  LZ4_prepareTable(&ctx->internal_donotuse,0,byU32);
  return;
}

Assistant:

void LZ4_resetStream_fast(LZ4_stream_t* ctx) {
    LZ4_prepareTable(&(ctx->internal_donotuse), 0, byU32);
}